

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O0

t_int * sigmund_perform(t_int *w)

{
  long lVar1;
  int iVar2;
  undefined4 *local_38;
  t_float *fp;
  int j;
  int n;
  t_sample *in;
  t_sigmund *x;
  t_int *w_local;
  
  lVar1 = w[1];
  iVar2 = (int)w[3];
  if (*(int *)(lVar1 + 0x70) % iVar2 == 0) {
    if (*(int *)(lVar1 + 0x6c) < 1) {
      if (*(int *)(lVar1 + 0x68) != *(int *)(lVar1 + 0x54)) {
        local_38 = (undefined4 *)(*(long *)(lVar1 + 0x60) + (long)*(int *)(lVar1 + 0x68) * 4);
        _j = (undefined4 *)w[2];
        for (fp._0_4_ = 0; (int)fp < iVar2; fp._0_4_ = (int)fp + 1) {
          *local_38 = *_j;
          local_38 = local_38 + 1;
          _j = _j + 1;
        }
        *(int *)(lVar1 + 0x68) = iVar2 + *(int *)(lVar1 + 0x68);
        if (*(int *)(lVar1 + 0x68) == *(int *)(lVar1 + 0x54)) {
          clock_delay(*(_clock **)(lVar1 + 0x30),0.0);
        }
      }
    }
    else {
      *(int *)(lVar1 + 0x6c) = *(int *)(lVar1 + 0x6c) - iVar2;
    }
  }
  w_local = w + 4;
  return w_local;
}

Assistant:

static t_int *sigmund_perform(t_int *w)
{
    t_sigmund *x = (t_sigmund *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    int n = (int)(w[3]);

    if (x->x_hop % n)
        return (w+4);
    if (x->x_countdown > 0)
        x->x_countdown -= n;
    else if (x->x_infill != x->x_npts)
    {
        int j;
        t_float *fp = x->x_inbuf + x->x_infill;
        for (j = 0; j < n; j++)
            *fp++ = *in++;
        x->x_infill += n;
        if (x->x_infill == x->x_npts)
            clock_delay(x->x_clock, 0);
    }
    return (w+4);
}